

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

bool __thiscall QToolBarAreaLayout::toolBarBreak(QToolBarAreaLayout *this,QToolBar *toolBar)

{
  QToolBarAreaLayoutLine *pQVar1;
  QToolBar *pQVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  bVar7 = true;
  uVar3 = 0;
  do {
    uVar6 = this->docks[uVar3].lines.d.size;
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        pQVar1 = this->docks[uVar3].lines.d.ptr;
        if (pQVar1[uVar5].toolBarItems.d.size != 0) {
          lVar4 = 0;
          uVar6 = 0;
          do {
            pQVar2 = (QToolBar *)
                     (**(code **)(**(long **)((long)&(pQVar1[uVar5].toolBarItems.d.ptr)->widgetItem
                                             + lVar4) + 0x68))();
            if (pQVar2 == toolBar) {
              return (bool)(bVar7 & (lVar4 == 0 && uVar5 != 0));
            }
            uVar6 = uVar6 + 1;
            lVar4 = lVar4 + 0x18;
          } while (uVar6 < (ulong)pQVar1[uVar5].toolBarItems.d.size);
          uVar6 = this->docks[uVar3].lines.d.size;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar6);
    }
    bVar7 = uVar3 < 3;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 4);
  return false;
}

Assistant:

bool QToolBarAreaLayout::toolBarBreak(QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar)
                    return j > 0 && k == 0;
            }
        }
    }

    return false;
}